

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

double __thiscall
TwoStageDynamicBayesianNetwork::GetYProbability
          (TwoStageDynamicBayesianNetwork *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *X,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *A,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Y)

{
  pointer puVar1;
  pointer puVar2;
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface *pMVar3;
  pointer pSVar4;
  CPDDiscreteInterface *pCVar5;
  Index IVar6;
  long lVar7;
  E *this_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_restr;
  allocator_type local_99;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  double local_70;
  double local_68;
  void *local_60 [2];
  long local_50;
  void *local_48 [2];
  long local_38;
  
  local_98 = A;
  lVar7 = (**(code **)((long)*this->_m_madp + 400))();
  if (((long)(Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2 == lVar7) &&
     ((long)(X->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(X->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 == lVar7)) {
    puVar1 = (local_98->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = (local_98->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar3 = this->_m_madp;
    lVar7 = (**(code **)(*(long *)((long)&pMVar3->field_0x0 + *(long *)((long)*pMVar3 + -0x40)) +
                        0x10))((long)&pMVar3->field_0x0 + *(long *)((long)*pMVar3 + -0x40));
    if ((long)puVar1 - (long)puVar2 >> 2 == lVar7) {
      if ((Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish ==
          (Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        dVar11 = 1.0;
      }
      else {
        uVar10 = 0;
        dVar11 = 1.0;
        local_78 = X;
        do {
          pSVar4 = (this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_68 = dVar11;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_90,
                     (long)pSVar4[uVar10].super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     *(long *)&pSVar4[uVar10].super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl >> 2,(allocator_type *)local_48);
          pSVar4 = (this->_m_XSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = *(long *)&pSVar4[uVar10].super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
          lVar8 = (long)pSVar4[uVar10].super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - lVar7;
          if (lVar8 != 0) {
            puVar1 = (local_78->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar9 = 0;
            do {
              local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] = puVar1[*(uint *)(lVar7 + uVar9 * 4)];
              uVar9 = uVar9 + 1;
            } while ((uVar9 & 0xffffffff) < (ulong)(lVar8 >> 2));
          }
          pSVar4 = (this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                     (long)pSVar4[uVar10].super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     *(long *)&pSVar4[uVar10].super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl >> 2,(allocator_type *)local_60);
          pSVar4 = (this->_m_ASoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = *(long *)&pSVar4[uVar10].super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
          lVar8 = (long)pSVar4[uVar10].super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - lVar7;
          if (lVar8 != 0) {
            puVar1 = (local_98->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar9 = 0;
            do {
              *(uint *)((long)local_48[0] + uVar9 * 4) = puVar1[*(uint *)(lVar7 + uVar9 * 4)];
              uVar9 = uVar9 + 1;
            } while ((uVar9 & 0xffffffff) < (ulong)(lVar8 >> 2));
          }
          pSVar4 = (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                     (long)pSVar4[uVar10].super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     *(long *)&pSVar4[uVar10].super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl >> 2,&local_99);
          pSVar4 = (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = *(long *)&pSVar4[uVar10].super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
          lVar8 = (long)pSVar4[uVar10].super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - lVar7;
          if (lVar8 != 0) {
            puVar1 = (Y->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar9 = 0;
            do {
              *(uint *)((long)local_60[0] + uVar9 * 4) = puVar1[*(uint *)(lVar7 + uVar9 * 4)];
              uVar9 = uVar9 + 1;
            } while ((uVar9 & 0xffffffff) < (ulong)(lVar8 >> 2));
          }
          IVar6 = IndividualToJointYiiIndices
                            (this,(Index)uVar10,&local_90,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
          pCVar5 = (this->_m_Y_CPDs).
                   super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10];
          (*pCVar5->_vptr_CPDDiscreteInterface[2])
                    (pCVar5,(ulong)(Y->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar10],(ulong)IVar6);
          local_70 = dVar11;
          if (local_60[0] != (void *)0x0) {
            operator_delete(local_60[0],local_50 - (long)local_60[0]);
          }
          if (local_48[0] != (void *)0x0) {
            operator_delete(local_48[0],local_38 - (long)local_48[0]);
          }
          if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_90.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          dVar11 = local_68 * local_70;
          uVar10 = (ulong)((Index)uVar10 + 1);
        } while (uVar10 < (ulong)((long)(Y->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(Y->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      return dVar11;
    }
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full joint actions");
  }
  else {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,
         "TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full state vectors");
  }
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

double TwoStageDynamicBayesianNetwork::
GetYProbability( const vector<Index>& X,
                    const vector<Index>& A,
                    const vector<Index>& Y) const
{
    size_t nrSF = _m_madp->GetNrStateFactors();
    if(Y.size() != nrSF || X.size() != nrSF)
        throw E("TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full state vectors");
    if(A.size() != _m_madp->GetNrAgents())
        throw E("TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full joint actions");
    
    double p = 1.0;
    for(Index y=0; y < Y.size(); y++)
    {
        vector<Index> X_restr(GetXSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToScope(X, GetXSoI_Y(y), X_restr );
        vector<Index> A_restr(GetASoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToScope(A, GetASoI_Y(y), A_restr );
        vector<Index> Y_restr(GetYSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToScope(Y, GetYSoI_Y(y), Y_restr );
        Index iiI = IndividualToJointYiiIndices(y, X_restr, A_restr, Y_restr);
        Index yVal = Y[y];
        double p_y = _m_Y_CPDs[y]->Get(yVal, iiI);  
        p *= p_y;
    }
    return(p);
}